

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plane.h
# Opt level: O2

bool __thiscall Plane::intersect(Plane *this,Ray *ray,Hit *h,float tmin)

{
  bool bVar1;
  int iVar2;
  float *pfVar3;
  Vector3f *pVVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  Vector3f local_60;
  Vector3f p;
  Vector3f local_48;
  Vector3f local_3c;
  
  fVar7 = this->d;
  pVVar4 = &this->norm;
  fVar5 = Vector3f::dot(&ray->o,pVVar4);
  fVar6 = Vector3f::dot(&ray->d,pVVar4);
  if ((((fVar6 == 0.0) && (!NAN(fVar6))) || (fVar6 = (fVar7 - fVar5) / fVar6, fVar6 < tmin)) ||
     (h->t <= fVar6)) {
    bVar1 = false;
  }
  else {
    h->t = fVar6;
    h->obj = &this->super_Object;
    Vector3f::operator=(&h->norm,pVVar4);
    iVar2 = (*((this->super_Object).m)->_vptr_Material[2])();
    if ((char)iVar2 == '\0') {
      pVVar4 = &p;
      fVar7 = 0.0;
      fVar5 = 0.0;
    }
    else {
      ::operator*(&local_48,fVar6);
      operator+(&ray->o,&local_48);
      operator-(&local_3c,&this->o);
      ::operator*((Matrix3f *)&p,(Vector3f *)&this->matrix);
      pfVar3 = Vector3f::operator[](&p,1);
      fVar7 = *pfVar3;
      pfVar3 = Vector3f::operator[](&p,2);
      fVar5 = *pfVar3;
      pVVar4 = &local_60;
    }
    Vector2f::Vector2f((Vector2f *)pVVar4,fVar7,fVar5);
    Vector2f::operator=(&h->pos,(Vector2f *)pVVar4);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool intersect(const Ray& ray, Hit& h, float tmin) override {
		float g = d - Vector3f::dot(ray.o, norm), w = Vector3f::dot(ray.d, norm);
		if (w == 0) return 0;
		float t = g / w;
		if (t < tmin || t >= h.t) return 0;
		h.t = t; h.obj = this; h.norm = norm;if (m->need_coords()) {
			Vector3f p = matrix * (ray.o + ray.d * t - o);
//			std::cerr << p[0] << "," << p[1] << "," << p[2] << "\n";
			h.pos = Vector2f(p[1], p[2]);
		}
		else h.pos = Vector2f(0, 0);
		return 1;
	}